

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O3

void __thiscall QMenuBarPrivate::calcActionRects(QMenuBarPrivate *this,int max_width,int start)

{
  QList<QRect> *this_00;
  int iVar1;
  QWidget *this_01;
  QAction *pQVar2;
  QWidgetData *pQVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  LayoutDirection direction;
  QStyle *pQVar10;
  QStyle *pQVar11;
  pointer pQVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  long in_FS_OFFSET;
  QRect QVar19;
  QIcon is;
  QFontMetrics fm;
  QStyleOptionMenuItem opt;
  int local_158;
  ulong local_148;
  QIcon local_f0;
  undefined8 local_e8;
  undefined1 *local_e0;
  undefined1 local_d8 [8];
  undefined1 *puStack_d0;
  undefined1 *local_c8;
  QArrayData *local_78;
  QIcon local_60 [2];
  QFont local_50 [24];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->super_QWidgetPrivate).field_0x254 & 1) != 0) {
    this_01 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    this_00 = &this->actionRects;
    QList<QRect>::resize(this_00,(this->super_QWidgetPrivate).actions.d.size);
    local_d8 = (undefined1  [8])0x0;
    puStack_d0 = (undefined1 *)0xffffffffffffffff;
    QList<QRect>::fill(this_00,(parameter_type)local_d8,-1);
    pQVar10 = QWidget::style(this_01);
    iVar5 = (**(code **)(*(long *)pQVar10 + 0xe0))(pQVar10,0x22,0,this_01);
    local_e0 = &DAT_aaaaaaaaaaaaaaaa;
    QFontMetrics::QFontMetrics((QFontMetrics *)&local_e0,&this_01->data->fnt);
    iVar6 = (**(code **)(*(long *)pQVar10 + 0xe0))(pQVar10,0x24,0,this_01);
    iVar7 = (**(code **)(*(long *)pQVar10 + 0xe0))(pQVar10,0x23,0,this_01);
    iVar8 = (**(code **)(*(long *)pQVar10 + 0xe0))(pQVar10,0x3e,0);
    if ((this->super_QWidgetPrivate).actions.d.size == 0) {
      local_148._0_4_ = 0;
      local_158 = -1;
      iVar1 = 0;
      iVar14 = 0;
    }
    else {
      local_158 = -1;
      lVar16 = 0xc;
      uVar18 = 0;
      iVar14 = 0;
      iVar1 = 0;
      local_148 = 0;
      do {
        pQVar2 = (this->super_QWidgetPrivate).actions.d.ptr[uVar18];
        cVar4 = QAction::isVisible();
        if (cVar4 != '\0') {
          local_e8 = 0xffffffffffffffff;
          cVar4 = QAction::isSeparator();
          if (cVar4 == '\0') {
            local_c8 = &DAT_aaaaaaaaaaaaaaaa;
            local_d8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
            puStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
            QAction::text();
            local_f0.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
            QAction::icon();
            cVar4 = QIcon::isNull();
            if (cVar4 == '\0') {
              iVar9 = (int)local_e8;
              if ((int)local_e8 <= iVar8) {
                iVar9 = iVar8;
              }
              if (local_e8._4_4_ <= iVar8) {
                local_e8._4_4_ = iVar8;
              }
              local_e8 = CONCAT44(local_e8._4_4_,iVar9);
            }
            else if (local_c8 != (undefined1 *)0x0) {
              local_e8 = QFontMetrics::size((int)&local_e0,(QString *)0x800,(int)local_d8,(int *)0x0
                                           );
            }
            QIcon::~QIcon(&local_f0);
            if (local_d8 != (undefined1  [8])0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_d8)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_d8)->_q_value).super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_d8)->_q_value).super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate((QArrayData *)local_d8,2,0x10);
              }
            }
            memset((QStyleOptionMenuItem *)local_d8,0xaa,0x98);
            QStyleOptionMenuItem::QStyleOptionMenuItem((QStyleOptionMenuItem *)local_d8);
            (**(code **)(*(long *)this_01 + 0x1a0))(this_01,(QStyleOptionMenuItem *)local_d8,pQVar2)
            ;
            pQVar11 = QWidget::style(this_01);
            local_e8 = (**(code **)(*(long *)pQVar11 + 0xe8))
                                 (pQVar11,8,(QStyleOptionMenuItem *)local_d8,&local_e8,this_01);
            iVar9 = (int)local_e8;
            iVar15 = (int)(local_e8 >> 0x20);
            if (0 < iVar15 && 0 < iVar9) {
              iVar13 = iVar5 + iVar9;
              iVar17 = 0;
              if (local_158 == -1) {
                iVar17 = iVar13;
                iVar13 = 0;
              }
              iVar1 = iVar1 + iVar13;
              iVar14 = iVar14 + iVar17;
              if ((int)local_148 <= iVar15) {
                local_148 = local_e8 >> 0x20;
              }
              pQVar12 = QList<QRect>::data(this_00);
              *(undefined8 *)((long)pQVar12 + lVar16 + -0xc) = 0;
              *(int *)((long)pQVar12 + lVar16 + -4) = iVar9 + -1;
              *(int *)((long)&(pQVar12->x1).m_i + lVar16) = iVar15 + -1;
            }
            QFont::~QFont(local_50);
            QIcon::~QIcon(local_60);
            if (local_78 != (QArrayData *)0x0) {
              LOCK();
              (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_78,2,0x10);
              }
            }
            QStyleOption::~QStyleOption((QStyleOption *)local_d8);
          }
          else {
            iVar9 = (**(code **)(*(long *)pQVar10 + 0xf0))(pQVar10,0x2f,0,this_01,0);
            if (iVar9 != 0) {
              local_158 = (int)uVar18;
            }
          }
        }
        uVar18 = uVar18 + 1;
        lVar16 = lVar16 + 0x10;
      } while (uVar18 < (ulong)(this->super_QWidgetPrivate).actions.d.size);
    }
    pQVar10 = QWidget::style(this_01);
    lVar16 = 0;
    iVar8 = (**(code **)(*(long *)pQVar10 + 0xe0))(pQVar10,0x21,0,this_01);
    if ((this->super_QWidgetPrivate).actions.d.size != 0) {
      iVar7 = iVar7 + iVar8;
      if (start == -1) {
        start = iVar6;
      }
      iVar8 = iVar8 + iVar5 + start;
      uVar18 = 0;
      do {
        pQVar12 = QList<QRect>::data(this_00);
        iVar9 = *(int *)((long)&(pQVar12->x1).m_i + lVar16);
        iVar15 = *(int *)((long)&(pQVar12->x2).m_i + lVar16);
        if ((iVar15 != iVar9 + -1) ||
           (*(int *)((long)&(pQVar12->y2).m_i + lVar16) !=
            *(int *)((long)&(pQVar12->y1).m_i + lVar16) + -1)) {
          iVar17 = iVar8;
          if ((long)local_158 <= (long)uVar18 && local_158 != -1) {
            iVar8 = (max_width + iVar8) - (iVar5 + iVar6 * 2 + iVar1 + iVar14);
            if (iVar8 < iVar14) {
              iVar17 = iVar6;
            }
            iVar13 = 0;
            if (iVar8 < iVar14) {
              iVar13 = (int)local_148;
              iVar14 = iVar6;
            }
            iVar7 = iVar13 + iVar7;
          }
          iVar15 = iVar15 - iVar9;
          *(int *)((long)&(pQVar12->x2).m_i + lVar16) = iVar8 + iVar15;
          *(int *)((long)&(pQVar12->x1).m_i + lVar16) = iVar8;
          *(int *)((long)&(pQVar12->y2).m_i + lVar16) = (int)local_148 + -1 + iVar7;
          *(int *)((long)&(pQVar12->y1).m_i + lVar16) = iVar7;
          iVar8 = iVar15 + iVar17 + iVar5 + 1;
          direction = QWidget::layoutDirection(this_01);
          pQVar3 = this_01->data;
          puStack_d0 = (undefined1 *)
                       CONCAT44((pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i,
                                (pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i);
          local_d8 = (undefined1  [8])0x0;
          QVar19 = QStyle::visualRect(direction,(QRect *)local_d8,
                                      (QRect *)((long)&(pQVar12->x1).m_i + lVar16));
          *(long *)((long)&(pQVar12->x1).m_i + lVar16) = QVar19._0_8_;
          *(long *)((long)&(pQVar12->x2).m_i + lVar16) = QVar19._8_8_;
        }
        uVar18 = uVar18 + 1;
        lVar16 = lVar16 + 0x10;
      } while (uVar18 < (ulong)(this->super_QWidgetPrivate).actions.d.size);
    }
    QFontMetrics::~QFontMetrics((QFontMetrics *)&local_e0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenuBarPrivate::calcActionRects(int max_width, int start) const
{
    Q_Q(const QMenuBar);

    if (!itemsDirty)
        return;

    //let's reinitialize the buffer
    actionRects.resize(actions.size());
    actionRects.fill(QRect());

    const QStyle *style = q->style();

    const int itemSpacing = style->pixelMetric(QStyle::PM_MenuBarItemSpacing, nullptr, q);
    int max_item_height = 0, separator = -1, separator_start = 0, separator_len = 0;

    //calculate size
    const QFontMetrics fm = q->fontMetrics();
    const int hmargin = style->pixelMetric(QStyle::PM_MenuBarHMargin, nullptr, q),
              vmargin = style->pixelMetric(QStyle::PM_MenuBarVMargin, nullptr, q),
                icone = style->pixelMetric(QStyle::PM_SmallIconSize, nullptr, q);
    for(int i = 0; i < actions.size(); i++) {
        QAction *action = actions.at(i);
        if (!action->isVisible())
            continue;

        QSize sz;

        //calc what I think the size is..
        if (action->isSeparator()) {
            if (style->styleHint(QStyle::SH_DrawMenuBarSeparator, nullptr, q))
                separator = i;
            continue; //we don't really position these!
        } else {
            const QString s = action->text();
            QIcon is = action->icon();
            // If an icon is set, only the icon is visible
            if (!is.isNull())
                sz = sz.expandedTo(QSize(icone, icone));
            else if (!s.isEmpty())
                sz = fm.size(Qt::TextShowMnemonic, s);
        }

        //let the style modify the above size..
        QStyleOptionMenuItem opt;
        q->initStyleOption(&opt, action);
        sz = q->style()->sizeFromContents(QStyle::CT_MenuBarItem, &opt, sz, q);

        if (!sz.isEmpty()) {
            { //update the separator state
                int iWidth = sz.width() + itemSpacing;
                if (separator == -1)
                    separator_start += iWidth;
                else
                    separator_len += iWidth;
            }
            //maximum height
            max_item_height = qMax(max_item_height, sz.height());
            //append
            actionRects[i] = QRect(0, 0, sz.width(), sz.height());
        }
    }

    //calculate position
    const int fw = q->style()->pixelMetric(QStyle::PM_MenuBarPanelWidth, nullptr, q);
    int x = fw + ((start == -1) ? hmargin : start) + itemSpacing;
    int y = fw + vmargin;
    for(int i = 0; i < actions.size(); i++) {
        QRect &rect = actionRects[i];
        if (rect.isNull())
            continue;

        //resize
        rect.setHeight(max_item_height);

        //move
        if (separator != -1 && i >= separator) { //after the separator
            int left = (max_width - separator_len - hmargin - itemSpacing) + (x - separator_start - hmargin);
            if (left < separator_start) { //wrap
                separator_start = x = hmargin;
                y += max_item_height;
            }
            rect.moveLeft(left);
        } else {
            rect.moveLeft(x);
        }
        rect.moveTop(y);

        //keep moving along..
        x += rect.width() + itemSpacing;

        //make sure we follow the layout direction
        rect = QStyle::visualRect(q->layoutDirection(), q->rect(), rect);
    }
}